

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::clara::TextFlow::Column::iterator::addIndentAndSuffix
          (string *__return_storage_ptr__,iterator *this,string *plain)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->m_stringIndex != 0 || this->m_pos != 0) ||
     (__n = this->m_column->m_initialIndent, __n == 0xffffffffffffffff)) {
    __n = this->m_column->m_indent;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_40,__n,' ');
  if (this->m_suffix == true) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar1 = (plain->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + plain->_M_string_length);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_60,"-");
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar1 = (plain->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + plain->_M_string_length);
  }
  pbVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
                     local_60._M_dataplus._M_p,local_60._M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto addIndentAndSuffix(std::string const &plain) const -> std::string {
			return std::string(indent(), ' ') + (m_suffix ? plain + "-" : plain);
		}